

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O3

Value __thiscall
xmrig::CpuBackendPrivate::hugePages(CpuBackendPrivate *this,int version,Document *doc)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  int iVar5;
  Value VVar6;
  Data local_40;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar3 == 0) {
    uVar1 = *(ulong *)(CONCAT44(in_register_00000034,version) + 0x10);
    uVar2 = *(ulong *)(CONCAT44(in_register_00000034,version) + 0x20);
    pthread_mutex_unlock((pthread_mutex_t *)mutex);
    iVar5 = (int)uVar1;
    iVar3 = (int)uVar2;
    if ((int)doc < 2) {
      *(undefined8 *)((long)&this->controller + 6) = 0;
      this->controller = (Controller *)0x0;
      *(ushort *)((long)&(this->status).m_errors + 6) = (iVar5 == iVar3) + 9;
      uVar4 = extraout_RDX;
    }
    else {
      local_40.n = (Number)(uVar1 & 0xffffffff);
      this->controller = (Controller *)0x0;
      (this->status).m_errors = 0;
      *(undefined2 *)((long)&(this->status).m_errors + 6) = 4;
      local_40.s.str = (Ch *)((ulong)(-1 < iVar5) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_40.s,
                 *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RCX + 0x10));
      local_40.s.str = (Ch *)((ulong)(-1 < iVar3) << 0x35 | 0x1d6000000000000);
      local_40.n = (Number)(uVar2 & 0xffffffff);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_40.s,
                 *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RCX + 0x10));
      uVar4 = extraout_RDX_00;
    }
    VVar6.data_.s.str = (Ch *)uVar4;
    VVar6.data_.n = (Number)this;
    return (Value)VVar6.data_;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

rapidjson::Value hugePages(int version, rapidjson::Document &doc)
    {
        std::pair<unsigned, unsigned> pages(0, 0);

        mutex.lock();

        pages.first  += status.hugePages();
        pages.second += status.pages();

        mutex.unlock();

        rapidjson::Value hugepages;

        if (version > 1) {
            hugepages.SetArray();
            hugepages.PushBack(pages.first, doc.GetAllocator());
            hugepages.PushBack(pages.second, doc.GetAllocator());
        }
        else {
            hugepages = pages.first == pages.second;
        }

        return hugepages;
    }